

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.hpp
# Opt level: O1

void __thiscall xe::xml::Writer::Attribute::Attribute(Attribute *this,char *name_,char *value_)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->value,value_,&local_12);
  return;
}

Assistant:

Attribute (const char* name_, const char* value_) : name(name_), value(value_) {}